

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O0

void __thiscall
soplex::SoPlexBase<double>::_updateSlacks(SoPlexBase<double> *this,SolRational *sol,int *primalSize)

{
  int iVar1;
  int *in_RDX;
  long in_RSI;
  long in_RDI;
  
  iVar1 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::size((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)(in_RDI + 0x4cc8));
  if (iVar1 < *in_RDX) {
    (**(code **)(**(long **)(in_RDI + 0x45c0) + 0x238))
              (*(long **)(in_RDI + 0x45c0),in_RDI + 0x4cc8,in_RSI + 0x18);
  }
  else {
    (**(code **)(**(long **)(in_RDI + 0x45c0) + 0x230))
              (*(long **)(in_RDI + 0x45c0),in_RSI,in_RSI + 0x18,1);
  }
  return;
}

Assistant:

void SoPlexBase<R>::_updateSlacks(SolRational& sol, int& primalSize)
{
   if(_primalDualDiff.size() < primalSize)
   {
      _rationalLP->addPrimalActivity(_primalDualDiff, sol._slacks);
#ifndef NDEBUG
      {
         VectorRational activity(numRowsRational());
         _rationalLP->computePrimalActivity(sol._primal, activity);
         assert(sol._slacks == activity);
      }
#endif
   }
   else
      _rationalLP->computePrimalActivity(sol._primal, sol._slacks);
}